

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFormatUtil.hpp
# Opt level: O2

ostream * tcu::Format::operator<<(ostream *str,Array<const_char_*const_*> *fmt)

{
  char **ppcVar1;
  
  std::operator<<(str,"{ ");
  for (ppcVar1 = fmt->begin; ppcVar1 != fmt->end; ppcVar1 = ppcVar1 + 1) {
    if (ppcVar1 != fmt->begin) {
      std::operator<<(str,", ");
    }
    std::operator<<(str,*ppcVar1);
  }
  std::operator<<(str," }");
  return str;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const Array<Iterator>& fmt)
{
	str << "{ ";
	for (Iterator cur = fmt.begin; cur != fmt.end; ++cur)
	{
		if (cur != fmt.begin)
			str << ", ";
		str << *cur;
	}
	str << " }";
	return str;
}